

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_afa34::CpuAbsoluteIndexedTest::run_readwrite_instruction_with_pagecrossing
          (CpuAbsoluteIndexedTest *this,uint8_t instruction,IndexReg index_reg,
          uint8_t new_memory_content)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *pCVar1;
  uchar uVar2;
  uint16_t uVar3;
  int iVar4;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar5;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar6;
  pointer *__ptr;
  char cVar7;
  _func_int *message;
  AssertionResult gtest_ar;
  _Any_data local_a8;
  code *local_98;
  int *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  MatcherBase<unsigned_char> local_78;
  undefined1 local_60 [8];
  MatcherBase<unsigned_char> local_58;
  MatcherBase<unsigned_short> local_40;
  
  uVar3 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar3;
  (this->super_CpuTest).registers.pc = uVar3;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  pCVar1 = &(this->super_CpuTest).expected;
  pCVar1->pc = pCVar1->pc + 2;
  if (index_reg == X) {
    (this->super_CpuTest).registers.x = 0x91;
    (this->super_CpuTest).expected.x = 0x91;
  }
  else {
    (this->super_CpuTest).registers.y = 0x91;
    (this->super_CpuTest).expected.y = 0x91;
  }
  this_00 = &(this->super_CpuTest).mmu;
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_78,*(short *)&(this->super_CpuTest).field_0x112 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                      ,0x89,"mmu","read_byte(start_pc + 1u)");
  local_88 = (int *)operator_new(4);
  *local_88 = 0x78;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_80,local_88);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar4 = *local_88;
  *(int *)&pAVar6[1]._vptr_ActionInterface = iVar4;
  *(char *)((long)&pAVar6[1]._vptr_ActionInterface + 4) = (char)iVar4;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_a8,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_78);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_78,*(short *)&(this->super_CpuTest).field_0x112 + 2);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                      ,0x8a,"mmu","read_byte(start_pc + 2u)");
  local_88 = (int *)operator_new(4);
  *local_88 = 0x56;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_80,local_88);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar4 = *local_88;
  *(int *)&pAVar6[1]._vptr_ActionInterface = iVar4;
  *(char *)((long)&pAVar6[1]._vptr_ActionInterface + 4) = (char)iVar4;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_a8,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x5609);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                      ,0x8b,"mmu","read_byte(0x5609)");
  local_88 = (int *)operator_new(4);
  *local_88 = 0xcd;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_80,local_88);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar4 = *local_88;
  *(int *)&pAVar6[1]._vptr_ActionInterface = iVar4;
  *(char *)((long)&pAVar6[1]._vptr_ActionInterface + 4) = (char)iVar4;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_a8,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x5709);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                      ,0x8e,"mmu","read_byte(effective_address)");
  uVar2 = (this->super_CpuTest).field_0x114;
  local_88 = (int *)operator_new(1);
  *(uchar *)local_88 = uVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_char*>
            (&local_80,(uchar *)local_88);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a11a0;
  iVar4 = *local_88;
  *(uchar *)&pAVar6[1]._vptr_ActionInterface = (uchar)iVar4;
  *(uchar *)((long)&pAVar6[1]._vptr_ActionInterface + 1) = (uchar)iVar4;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_a8,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_a8,0x5709);
  testing::Matcher<unsigned_char>::Matcher
            ((Matcher<unsigned_char> *)&local_78,(this->super_CpuTest).field_0x114);
  n_e_s::core::test::MockMmu::gmock_write_byte
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_a8,(Matcher<unsigned_char> *)&local_78);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
             ,0x91,"mmu","write_byte(effective_address, memory_content)");
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &(((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
              .super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase
            ((MatcherBase<unsigned_char> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&local_78);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_a8);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_a8,0x5709);
  testing::Matcher<unsigned_char>::Matcher((Matcher<unsigned_char> *)&local_78,new_memory_content);
  n_e_s::core::test::MockMmu::gmock_write_byte
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_a8,(Matcher<unsigned_char> *)&local_78);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
             ,0x92,"mmu","write_byte(effective_address, new_memory_content)");
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &(((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
              .super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase
            ((MatcherBase<unsigned_char> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&local_78);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_a8);
  cVar7 = '\a';
  do {
    (*(((this->super_CpuTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar7 = cVar7 + -1;
  } while (cVar7 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_60,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
               ,0x95,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_a8._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_a8._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_60)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

void run_readwrite_instruction_with_pagecrossing(uint8_t instruction,
            IndexReg index_reg,
            uint8_t new_memory_content) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 2;

        const uint8_t index_reg_value{0x91};
        set_index_reg(index_reg, index_reg_value);

        const uint16_t effective_address = 0x5678 + index_reg_value;

        EXPECT_CALL(mmu, read_byte(start_pc + 1u)).WillOnce(Return(0x78));
        EXPECT_CALL(mmu, read_byte(start_pc + 2u)).WillOnce(Return(0x56));
        EXPECT_CALL(mmu, read_byte(0x5609))
                .WillOnce(Return(
                        0xCD)); // Dummy read with on wrong page (0x5678 + 0x91)
        EXPECT_CALL(mmu, read_byte(effective_address))
                .WillOnce(Return(memory_content));
        EXPECT_CALL(mmu,
                write_byte(effective_address, memory_content)); // Dummy write
        EXPECT_CALL(mmu, write_byte(effective_address, new_memory_content));

        step_execution(7);
        EXPECT_EQ(expected, registers);
    }